

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_columnref.cpp
# Opt level: O2

QualifiedColumnName *
duckdb::TransformQualifiedColumnName(QualifiedColumnName *__return_storage_ptr__,PGList *list)

{
  ParserException *this;
  allocator local_41;
  string local_40;
  
  QualifiedColumnName::QualifiedColumnName(__return_storage_ptr__);
  switch(list->length) {
  case 1:
    break;
  case 2:
    ::std::__cxx11::string::assign((char *)&__return_storage_ptr__->table);
    break;
  case 3:
    ::std::__cxx11::string::assign((char *)&__return_storage_ptr__->schema);
    ::std::__cxx11::string::assign((char *)&__return_storage_ptr__->table);
    break;
  case 4:
    ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
    ::std::__cxx11::string::assign((char *)&__return_storage_ptr__->schema);
    ::std::__cxx11::string::assign((char *)&__return_storage_ptr__->table);
    break;
  default:
    this = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Qualified column name must have between 1 and 4 elements",
               &local_41);
    ParserException::ParserException(this,&local_40);
    __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::assign((char *)&__return_storage_ptr__->column);
  return __return_storage_ptr__;
}

Assistant:

QualifiedColumnName TransformQualifiedColumnName(duckdb_libpgquery::PGList &list) {
	QualifiedColumnName result;
	switch (list.length) {
	case 1:
		result.column = const_char_ptr_cast(list.head->data.ptr_value);
		break;
	case 2:
		result.table = const_char_ptr_cast(list.head->data.ptr_value);
		result.column = const_char_ptr_cast(list.head->next->data.ptr_value);
		break;
	case 3:
		result.schema = const_char_ptr_cast(list.head->data.ptr_value);
		result.table = const_char_ptr_cast(list.head->next->data.ptr_value);
		result.column = const_char_ptr_cast(list.head->next->next->data.ptr_value);
		break;
	case 4:
		result.catalog = const_char_ptr_cast(list.head->data.ptr_value);
		result.schema = const_char_ptr_cast(list.head->next->data.ptr_value);
		result.table = const_char_ptr_cast(list.head->next->next->data.ptr_value);
		result.column = const_char_ptr_cast(list.head->next->next->next->data.ptr_value);
		break;
	default:
		throw ParserException("Qualified column name must have between 1 and 4 elements");
	}
	return result;
}